

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

void flatbuffers::GenField<unsigned_char>
               (FieldDef *fd,Table *table,bool fixed,int indent_step,int indent,string *_text)

{
  Table val;
  ushort uVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  
  uVar2 = (fd->value).offset;
  if ((int)CONCAT71(in_register_00000011,fixed) == 0) {
    if ((ushort)uVar2 < *(ushort *)(table + -(long)*(int *)table)) {
      uVar1 = *(ushort *)(table + ((ulong)(ushort)uVar2 - (long)*(int *)table));
    }
    else {
      uVar1 = 0;
    }
    if (uVar1 == 0) {
      val = (Table)0x0;
      goto LAB_00113992;
    }
    uVar2 = (uint)uVar1;
  }
  val = table[uVar2];
LAB_00113992:
  Print<unsigned_char>((uchar)val,(fd->value).type,indent,indent_step,(StructDef *)0x0,_text);
  return;
}

Assistant:

static void GenField(const FieldDef &fd,
                                          const Table *table, bool fixed,
                                          int indent_step, int indent,
                                          std::string *_text) {
  Print(fixed ?
    reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset) :
    table->GetField<T>(fd.value.offset, 0), fd.value.type, indent, indent_step,
                       nullptr, _text);
}